

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O3

void __thiscall tst_qpromise_convert::fulfillTAsQVariant(tst_qpromise_convert *this)

{
  int *piVar1;
  QSharedData *pQVar2;
  _Any_data *this_00;
  PromiseResolver<QVariant> PVar3;
  undefined8 uVar4;
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *pPVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  undefined4 uVar9;
  char *pcVar10;
  char *pcVar11;
  PromiseData<QVariant> *pPVar12;
  PrivateShared *pPVar14;
  QMetaType QVar15;
  PrivateShared *pPVar16;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar17;
  QPromise<QVariant> p_1;
  PromiseResolver<QVariant> resolver;
  QVariant value;
  code *local_e8;
  QPromise<QVariant> p;
  QPromise<QVariant> local_a8;
  undefined1 local_98 [24];
  _Invoker_type p_Stack_80;
  undefined **local_78;
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *local_70;
  undefined1 local_68 [24];
  _Invoker_type p_Stack_50;
  Foo local_44;
  _func_int **local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QVariant>_> QVar13;
  
  local_68._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&value,(int *)local_68);
  QtPromise::QPromise<int>::convert<QVariant>((QPromise<int> *)&p);
  value.d.data.shared = (PrivateShared *)&PTR__QPromiseBase_00150110;
  if (value.d.data._8_8_ != 0) {
    LOCK();
    piVar1 = (int *)(value.d.data._8_8_ + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (value.d.data._8_8_ != 0)) {
      (**(code **)(*(long *)value.d.data._8_8_ + 8))();
    }
  }
  local_68._0_8_ = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  p_Stack_50 = (_Invoker_type)((long)&iRam0000000000000000 + 2);
  waitForValue<QVariant>(&value,&p,(QVariant *)local_68);
  QVariant::QVariant((QVariant *)local_98,0x2a);
  bVar6 = (bool)QVariant::equals(&value);
  pcVar10 = QTest::toString<QVariant>(&value);
  pcVar11 = QTest::toString<QVariant>((QVariant *)local_98);
  cVar7 = QTest::compare_helper
                    (bVar6,"Compared values are not the same",pcVar10,pcVar11,
                     "waitForValue(p, QVariant{})","QVariant{42}",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xaf);
  QVariant::~QVariant((QVariant *)local_98);
  QVariant::~QVariant(&value);
  QVariant::~QVariant((QVariant *)local_68);
  QVar13 = p.super_QPromiseBase<QVariant>.m_d;
  if (cVar7 == '\0') {
    cVar7 = '\0';
  }
  else {
    bVar6 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isPending
                      (&(p.super_QPromiseBase<QVariant>.m_d.d)->
                        super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
    cVar7 = QTest::qVerify((bool)(~bVar6 & ((QVar13.d)->
                                           super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)
                                           .m_error.m_data._M_exception_object == (void *)0x0),
                           "p.isFulfilled()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xb0);
  }
  p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001501d0;
  if (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QVariant>.m_d.d)->
              super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
      (*((p.super_QPromiseBase<QVariant>.m_d.d)->
        super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (cVar7 == '\0') {
    return;
  }
  local_44.m_foo = 0x2a;
  QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_78,&local_44);
  p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<QVariant>.m_d.d = (PromiseData<QVariant> *)0x0;
  p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001501d0;
  pPVar12 = (PromiseData<QVariant> *)operator_new(0x68);
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData = 0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_settled = 0;
  (pPVar12->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00150960;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_001508f8;
  (pPVar12->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar12 != (PromiseData<QVariant> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar12->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001508c0;
  p_1.super_QPromiseBase<QVariant>.m_d.d = pPVar12;
  local_a8.super_QPromiseBase<QVariant>.m_d.d = pPVar12;
  QtPromisePrivate::PromiseResolver<QVariant>::PromiseResolver(&resolver,&local_a8);
  local_a8.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001501d0;
  QVar13.d = local_a8.super_QPromiseBase<QVariant>.m_d.d;
  if (local_a8.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0) {
    LOCK();
    pQVar2 = &((local_a8.super_QPromiseBase<QVariant>.m_d.d)->
              super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_a8.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
      uVar8 = (*((local_a8.super_QPromiseBase<QVariant>.m_d.d)->
                super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])
                        ();
      QVar13.d = (PromiseData<QVariant> *)(ulong)uVar8;
    }
  }
  pPVar5 = local_70;
  PVar3.m_d.d = resolver.m_d.d;
  local_40 = (_func_int **)&PTR__QPromiseBase_001508c0;
  if (resolver.m_d.d == (Data *)0x0) {
    value.d.data.shared = (PrivateShared *)0x0;
LAB_0010ea72:
    value.d.data._8_8_ = 0;
    uVar9 = (undefined4)CONCAT71((int7)((ulong)QVar13.d >> 8),1);
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      value.d.data.shared = (PrivateShared *)resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010ea72;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    value.d.data.shared = (PrivateShared *)resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    value.d.data._8_8_ = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    uVar9 = 0;
  }
  uVar4 = value.d.data._8_8_;
  this_00 = (_Any_data *)((long)&value.d.data + 0x10);
  std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)this_00,
             (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)&p);
  local_68._16_8_ = 0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._0_8_ = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  pPVar14 = (PrivateShared *)operator_new(0x30);
  *(PrivateShared **)pPVar14 = value.d.data.shared;
  if (value.d.data.shared != (PrivateShared *)0x0) {
    LOCK();
    *(int *)value.d.data.shared = *(int *)value.d.data.shared + 1;
    UNLOCK();
  }
  *(undefined8 *)(pPVar14 + 8) = value.d.data._8_8_;
  if (value.d.data._8_8_ != 0) {
    LOCK();
    *(int *)value.d.data._8_8_ = *(int *)value.d.data._8_8_ + 1;
    UNLOCK();
  }
  std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)(pPVar14 + 0x10),
             (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)this_00);
  p_Stack_50 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68._16_8_ =
       std::
       _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  local_68._0_8_ = pPVar14;
  if (local_e8 != (code *)0x0) {
    (*local_e8)(this_00,this_00,__destroy_functor);
  }
  uVar17 = uVar9;
  if (value.d.data._8_8_ != 0) {
    LOCK();
    *(int *)value.d.data._8_8_ = *(int *)value.d.data._8_8_ + -1;
    UNLOCK();
    if (*(int *)value.d.data._8_8_ == 0) {
      operator_delete((void *)value.d.data._8_8_,0x10);
    }
  }
  if (value.d.data.shared != (PrivateShared *)0x0) {
    LOCK();
    *(int *)value.d.data.shared = *(int *)value.d.data.shared + -1;
    UNLOCK();
    if (*(int *)value.d.data.shared == 0) {
      operator_delete(value.d.data.shared,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
            (pPVar5,(function<void_(const_(anonymous_namespace)::Foo_&)> *)local_68);
  if ((code *)local_68._16_8_ != (code *)0x0) {
    (*(code *)local_68._16_8_)(local_68,local_68,3);
  }
  pPVar5 = local_70;
  cVar7 = (char)uVar9;
  if (cVar7 == '\0') {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + 1;
    UNLOCK();
  }
  local_98._16_8_ = 0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_98._0_8_ = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._0_8_ = operator_new(8);
  *(undefined8 *)local_98._0_8_ = uVar4;
  if (cVar7 == '\0') {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + 1;
    UNLOCK();
    p_Stack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_98._16_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_manager;
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + -1;
    UNLOCK();
    if (*(int *)uVar4 == 0) {
      operator_delete((void *)uVar4,0x10);
    }
  }
  else {
    p_Stack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_98._16_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_manager;
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addCatcher
            (pPVar5,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98);
  if ((code *)local_98._16_8_ != (code *)0x0) {
    (*(code *)local_98._16_8_)(local_98,local_98,3);
  }
  if (cVar7 == '\0') {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + -1;
    UNLOCK();
    if (*(int *)uVar4 == 0) {
      operator_delete((void *)uVar4,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  pPVar5 = local_70;
  p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = local_40;
  bVar6 = QtPromisePrivate::
          PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
          isPending(local_70);
  if (!bVar6) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
              (pPVar5);
  }
  std::
  _Function_handler<QVariant_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:605:16)>
  ::_M_manager((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  local_78 = &PTR__QPromiseBase_0014f370;
  LOCK();
  pQVar2 = &pPVar5->super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (local_70 !=
      (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *)0x0)
     ) {
    (*local_70->_vptr_PromiseDataBase[1])();
  }
  p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<QVariant>.m_d.d = (PromiseData<QVariant> *)0x0;
  waitForValue<QVariant>(&value,&p_1,(QVariant *)&p);
  QVariant::~QVariant((QVariant *)&p);
  local_a8.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(local_a8.super_QPromiseBase<QVariant>._vptr_QPromiseBase._4_4_,0x2a);
  QVariant::QVariant((QVariant *)&p,(QMetaType)0x1513f0,&local_a8);
  bVar6 = (bool)QVariant::equals(&value);
  pcVar10 = QTest::toString<QVariant>(&value);
  pcVar11 = QTest::toString<QVariant>((QVariant *)&p);
  cVar7 = QTest::compare_helper
                    (bVar6,"Compared values are not the same",pcVar10,pcVar11,"value",
                     "QVariant::fromValue(Foo{42})",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xba);
  pPVar14 = (PrivateShared *)&p;
  QVariant::~QVariant((QVariant *)pPVar14);
  if (cVar7 != '\0') {
    QVar15.d_ptr._4_4_ = uVar17;
    QVar15.d_ptr._0_4_ = in_stack_fffffffffffffed8;
    bVar6 = operator==((QMetaType)p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase,QVar15);
    if (bVar6) {
      pPVar14 = (PrivateShared *)&value;
      if ((value.d._24_1_ & 1) != 0) {
        pPVar14 = value.d.data.shared + *(int *)(value.d.data.shared + 4);
      }
    }
    else {
      p.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
           (_func_int **)
           CONCAT44(p.super_QPromiseBase<QVariant>._vptr_QPromiseBase._4_4_,0xffffffff);
      pPVar16 = (PrivateShared *)&value;
      QVar15.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if ((value.d._24_1_ & 1) != 0) {
        pPVar16 = value.d.data.shared + *(int *)(value.d.data.shared + 4);
      }
      QMetaType::convert(QVar15,pPVar16,(QMetaType)0x1513f0,pPVar14);
    }
    cVar7 = QTest::qCompare(*(int *)pPVar14,0x2a,"value.value<Foo>().m_foo","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0xbb);
    QVar13 = p_1.super_QPromiseBase<QVariant>.m_d;
    if (cVar7 != '\0') {
      bVar6 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isPending
                        (&(p_1.super_QPromiseBase<QVariant>.m_d.d)->
                          super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
      QTest::qVerify((bool)(~bVar6 & ((QVar13.d)->
                                     super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).
                                     m_error.m_data._M_exception_object == (void *)0x0),
                     "p.isFulfilled()","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xbc);
      QVariant::~QVariant(&value);
      goto LAB_0010eeda;
    }
  }
  QVar13.d = p_1.super_QPromiseBase<QVariant>.m_d.d;
  QVariant::~QVariant(&value);
  if (QVar13.d == (PromiseData<QVariant> *)0x0) {
    return;
  }
LAB_0010eeda:
  p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001501d0;
  LOCK();
  pQVar2 = &((QVar13.d)->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData
  ;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p_1.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
    (*((p_1.super_QPromiseBase<QVariant>.m_d.d)->
      super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsQVariant()
{
    // Primitive type to QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QCOMPARE(waitForValue(p, QVariant{}), QVariant{42});
        QVERIFY(p.isFulfilled());
    }

    // Non-Qt user-defined type to QVariant.
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QVariant value = waitForValue(p, QVariant{});
        QCOMPARE(value, QVariant::fromValue(Foo{42}));
        QCOMPARE(value.value<Foo>().m_foo, 42);
        QVERIFY(p.isFulfilled());
    }
}